

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt2pbf.cpp
# Opt level: O0

void pbrt::semantic::pbrt2pbf(int ac,char **av)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  ostream *poVar4;
  long lVar5;
  long in_RSI;
  int in_EDI;
  Scene *unaff_retaddr;
  SP scene;
  string *in_stack_00000120;
  string *in_stack_00000128;
  string arg;
  int i;
  string outFileName;
  string inFileName;
  char *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe18;
  undefined6 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  char *in_stack_fffffffffffffe28;
  allocator *paVar6;
  allocator local_199;
  string local_198 [48];
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [55];
  allocator local_79;
  string local_78 [36];
  int local_54;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  undefined4 in_stack_fffffffffffffff8;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  for (local_54 = 1; local_54 < in_EDI; local_54 = local_54 + 1) {
    pcVar3 = *(char **)(local_10 + (long)local_54 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,pcVar3,&local_79);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    bVar1 = std::operator==(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    if (bVar1) {
      lVar5 = (long)local_54;
      local_54 = local_54 + 1;
      std::__cxx11::string::operator=(local_50,*(char **)(local_10 + 8 + lVar5 * 8));
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_78);
      if (*pcVar3 == '-') {
        std::operator+(in_stack_fffffffffffffe28,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffe27,
                                CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)));
        std::operator+(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
        usage((string *)0x10cfeb);
        std::__cxx11::string::~string(local_b0);
        std::__cxx11::string::~string(local_d0);
      }
      else {
        std::__cxx11::string::operator=(local_30,local_78);
      }
    }
    std::__cxx11::string::~string(local_78);
  }
  bVar1 = std::operator==(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"no output file specified (-o <file.pbff>)",&local_f1);
    usage((string *)0x10d0e7);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  }
  bVar1 = std::operator==(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"no input pbrt file specified",&local_119);
    usage((string *)0x10d1c8);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
  }
  paVar6 = &local_141;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,".pbf",paVar6);
  bVar1 = endsWith((string *)
                   CONCAT17(in_stack_fffffffffffffe27,
                            CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
                   in_stack_fffffffffffffe18);
  bVar2 = bVar1 ^ 0xff;
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  if ((bVar2 & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "output file name missing \'.pbsf\' extension - adding it ...");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::__cxx11::string::operator=(local_50,local_168);
    std::__cxx11::string::~string(local_168);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"parsing pbrt file ");
  poVar4 = std::operator<<(poVar4,local_30);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"",&local_199);
  importPBRT(in_stack_00000128,in_stack_00000120);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  poVar4 = std::operator<<((ostream *)&std::cout,"\x1b[1;32m done importing scene.\x1b[0m");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"writing to binary file ");
  poVar4 = std::operator<<(poVar4,local_50);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x10d4b9)
  ;
  Scene::saveTo(unaff_retaddr,(string *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
  poVar4 = std::operator<<((ostream *)&std::cout,"\x1b[1;32m => yay! writing successful...\x1b[0m");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<pbrt::Scene>::~shared_ptr((shared_ptr<pbrt::Scene> *)0x10d503);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void pbrt2pbf(int ac, char **av)
    {
      std::string inFileName;
      std::string outFileName;
      for (int i=1;i<ac;i++) {
        const std::string arg = av[i];
        if (arg == "-o") {
          assert(i+1 < ac);
          outFileName = av[++i];
        } else if (arg[0] != '-') {
          inFileName = arg;
        } else {
          usage("invalid argument '"+arg+"'");
        }          
      }

      if (outFileName == "")
        usage("no output file specified (-o <file.pbff>)");
      if (inFileName == "")
        usage("no input pbrt file specified");

      if (!endsWith(outFileName,".pbf")) {
        std::cout << "output file name missing '.pbsf' extension - adding it ..." << std::endl;
        outFileName = outFileName+".pbf";
      }
      
      std::cout << "-------------------------------------------------------" << std::endl;
      std::cout << "parsing pbrt file " << inFileName << std::endl;
      // try {
        Scene::SP scene = importPBRT(inFileName);
        std::cout << "\033[1;32m done importing scene.\033[0m" << std::endl;
        std::cout << "writing to binary file " << outFileName << std::endl;
        scene->saveTo(outFileName);
        std::cout << "\033[1;32m => yay! writing successful...\033[0m" << std::endl;
      // } catch (std::runtime_error &e) {
      //   cout << "\033[1;31mError in parsing: " << e.what() << "\033[0m\n";
      //   throw e;
      // }
    }